

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O3

BrotliDecoderErrorCode
duckdb_brotli::DecodeVarLenUint8(BrotliDecoderStateInternal *s,BrotliBitReader *br,uint64_t *value)

{
  BrotliRunningDecodeUint8State BVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t uVar5;
  byte *pbVar6;
  
  BVar1 = s->substate_decode_uint8;
  if (BVar1 == BROTLI_STATE_DECODE_UINT8_NONE) {
    if (br->bit_pos_ == 0) {
      pbVar6 = br->next_in;
      if (pbVar6 == br->last_in) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar3 = (ulong)*pbVar6 | br->val_;
      br->next_in = pbVar6 + 1;
      uVar4 = 7;
    }
    else {
      uVar3 = br->val_;
      uVar4 = br->bit_pos_ - 1;
    }
    br->bit_pos_ = uVar4;
    br->val_ = uVar3 >> 1;
    if ((uVar3 & 1) == 0) {
      *value = 0;
      return BROTLI_DECODER_SUCCESS;
    }
  }
  else {
    if (BVar1 != BROTLI_STATE_DECODE_UINT8_SHORT) {
      if (BVar1 != BROTLI_STATE_DECODE_UINT8_LONG) {
        return BROTLI_DECODER_ERROR_UNREACHABLE;
      }
      uVar3 = *value;
      goto LAB_01c03710;
    }
    uVar4 = br->bit_pos_;
  }
  if (uVar4 < 3) {
    pbVar6 = br->next_in;
    if (pbVar6 == br->last_in) {
      s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_SHORT;
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    uVar3 = (ulong)*pbVar6 << ((byte)uVar4 & 0x3f) | br->val_;
    uVar4 = uVar4 | 8;
    br->next_in = pbVar6 + 1;
  }
  else {
    uVar3 = br->val_;
  }
  br->bit_pos_ = uVar4 - 3;
  br->val_ = uVar3 >> 3;
  uVar3 = uVar3 & 7;
  if (uVar3 == 0) {
    *value = 1;
    s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
    return BROTLI_DECODER_SUCCESS;
  }
  *value = uVar3;
LAB_01c03710:
  uVar4 = br->bit_pos_;
  if (uVar4 < uVar3) {
    pbVar6 = br->next_in;
    do {
      if (pbVar6 == br->last_in) {
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_LONG;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar5 = (ulong)*pbVar6 << ((byte)uVar4 & 0x3f) | br->val_;
      br->val_ = uVar5;
      uVar4 = uVar4 + 8;
      br->bit_pos_ = uVar4;
      pbVar6 = pbVar6 + 1;
      br->next_in = pbVar6;
    } while (uVar4 < uVar3);
  }
  else {
    uVar5 = br->val_;
  }
  uVar2 = *(ulong *)(kBrotliBitMask + uVar3 * 8);
  br->bit_pos_ = uVar4 - uVar3;
  br->val_ = uVar5 >> ((byte)uVar3 & 0x3f);
  *value = (ulong)(uint)(1 << ((byte)*value & 0x1f)) + (uVar2 & uVar5);
  s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
  return BROTLI_DECODER_SUCCESS;
}

Assistant:

static BROTLI_NOINLINE BrotliDecoderErrorCode DecodeVarLenUint8(BrotliDecoderState *s, BrotliBitReader *br,
                                                                brotli_reg_t *value) {
	brotli_reg_t bits;
	switch (s->substate_decode_uint8) {
	case BROTLI_STATE_DECODE_UINT8_NONE:
		if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, 1, &bits))) {
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		if (bits == 0) {
			*value = 0;
			return BROTLI_DECODER_SUCCESS;
		}
		/* Fall through. */

	case BROTLI_STATE_DECODE_UINT8_SHORT:
		if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, 3, &bits))) {
			s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_SHORT;
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		if (bits == 0) {
			*value = 1;
			s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
			return BROTLI_DECODER_SUCCESS;
		}
		/* Use output value as a temporary storage. It MUST be persisted. */
		*value = bits;
		/* Fall through. */

	case BROTLI_STATE_DECODE_UINT8_LONG:
		if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, *value, &bits))) {
			s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_LONG;
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		*value = (1U << *value) + bits;
		s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
		return BROTLI_DECODER_SUCCESS;

	default:
		return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE); /* COV_NF_LINE */
	}
}